

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_parse_url_path(connectdata *conn)

{
  size_t sVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  size_t sVar5;
  size_t local_b0;
  char *local_a8;
  size_t local_98;
  size_t n;
  char *oldPath;
  char *comp;
  size_t compLen;
  char *str;
  char *pcStack_68;
  int dirAlloc;
  char *curPos;
  size_t dirlen;
  size_t pathLen;
  char *rawPath;
  char *pcStack_40;
  CURLcode result;
  char *fileName;
  char *slashPos;
  ftp_conn *ftpc;
  FTP *ftp;
  Curl_easy *data;
  connectdata *conn_local;
  
  ftp = (FTP *)conn->data;
  ftpc = (ftp_conn *)(((Curl_easy *)ftp)->req).protop;
  slashPos = (char *)&conn->proto;
  fileName = (char *)0x0;
  pcStack_40 = (char *)0x0;
  rawPath._4_4_ = 0;
  pathLen = 0;
  dirlen = 0;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  data = (Curl_easy *)conn;
  rawPath._4_4_ =
       Curl_urldecode((Curl_easy *)ftp,(ftpc->pp).cache,0,(char **)&pathLen,&dirlen,REJECT_CTRL);
  if (rawPath._4_4_ != CURLE_OK) {
    return rawPath._4_4_;
  }
  iVar2 = *(int *)&ftp[0x60].path;
  if (iVar2 != 1) {
    if (iVar2 == 2) {
      if ((dirlen != 0) && (*(char *)(pathLen + (dirlen - 1)) != '/')) {
        pcStack_40 = (char *)pathLen;
      }
      goto LAB_00125530;
    }
    if (iVar2 == 3) {
      fileName = strrchr((char *)pathLen,0x2f);
      if (fileName == (char *)0x0) {
        pcStack_40 = (char *)pathLen;
      }
      else {
        curPos = fileName + -pathLen;
        if (curPos == (char *)0x0) {
          curPos = (char *)0x1;
        }
        pvVar3 = (*Curl_ccalloc)(1,8);
        *(void **)(slashPos + 0x98) = pvVar3;
        if (*(long *)(slashPos + 0x98) == 0) {
          (*Curl_cfree)((void *)pathLen);
          return CURLE_OUT_OF_MEMORY;
        }
        pvVar3 = (*Curl_ccalloc)(1,(size_t)(curPos + 1));
        **(undefined8 **)(slashPos + 0x98) = pvVar3;
        if (**(long **)(slashPos + 0x98) == 0) {
          (*Curl_cfree)((void *)pathLen);
          return CURLE_OUT_OF_MEMORY;
        }
        strncpy((char *)**(undefined8 **)(slashPos + 0x98),(char *)pathLen,(size_t)curPos);
        slashPos[0xa0] = '\x01';
        slashPos[0xa1] = '\0';
        slashPos[0xa2] = '\0';
        slashPos[0xa3] = '\0';
        pcStack_40 = fileName + 1;
      }
      goto LAB_00125530;
    }
  }
  pcStack_68 = (char *)pathLen;
  str._4_4_ = 0;
  for (compLen = pathLen; *(char *)compLen != '\0'; compLen = compLen + 1) {
    if (*(char *)compLen == '/') {
      str._4_4_ = str._4_4_ + 1;
    }
  }
  if (0 < str._4_4_) {
    pvVar3 = (*Curl_ccalloc)((long)str._4_4_,8);
    *(void **)(slashPos + 0x98) = pvVar3;
    if (*(long *)(slashPos + 0x98) == 0) {
      (*Curl_cfree)((void *)pathLen);
      return CURLE_OUT_OF_MEMORY;
    }
    while (fileName = strchr(pcStack_68,0x2f), fileName != (char *)0x0) {
      comp = fileName + -(long)pcStack_68;
      if ((comp == (char *)0x0) && (*(int *)(slashPos + 0xa0) == 0)) {
        comp = (char *)0x1;
      }
      if (comp != (char *)0x0) {
        pcVar4 = (char *)(*Curl_ccalloc)(1,(size_t)(comp + 1));
        if (pcVar4 == (char *)0x0) {
          (*Curl_cfree)((void *)pathLen);
          return CURLE_OUT_OF_MEMORY;
        }
        strncpy(pcVar4,pcStack_68,(size_t)comp);
        iVar2 = *(int *)(slashPos + 0xa0);
        *(int *)(slashPos + 0xa0) = iVar2 + 1;
        *(char **)(*(long *)(slashPos + 0x98) + (long)iVar2 * 8) = pcVar4;
      }
      pcStack_68 = fileName + 1;
    }
    fileName = (char *)0x0;
  }
  pcStack_40 = pcStack_68;
LAB_00125530:
  if ((pcStack_40 == (char *)0x0) || (*pcStack_40 == '\0')) {
    slashPos[0xa8] = '\0';
    slashPos[0xa9] = '\0';
    slashPos[0xaa] = '\0';
    slashPos[0xab] = '\0';
    slashPos[0xac] = '\0';
    slashPos[0xad] = '\0';
    slashPos[0xae] = '\0';
    slashPos[0xaf] = '\0';
  }
  else {
    pcVar4 = (*Curl_cstrdup)(pcStack_40);
    *(char **)(slashPos + 0xa8) = pcVar4;
  }
  sVar1 = dirlen;
  if (((((ulong)ftp[0x7d].downloadsize >> 0x1d & 1) == 0) || (*(long *)(slashPos + 0xa8) != 0)) ||
     ((int)(ftpc->pp).nread_resp != 0)) {
    slashPos[0xb2] = '\0';
    if ((*(int *)&ftp[0x60].path == 2) && (*(char *)pathLen == '/')) {
      slashPos[0xb2] = '\x01';
    }
    else {
      if ((*(ulong *)((long)&(data->set).debugdata + 4) >> 6 & 1) == 0) {
        local_a8 = "";
      }
      else {
        local_a8 = *(char **)(slashPos + 0xc0);
      }
      if (local_a8 != (char *)0x0) {
        if (*(int *)&ftp[0x60].path == 2) {
          local_98 = 0;
        }
        else {
          if (*(long *)(slashPos + 0xa8) == 0) {
            local_b0 = 0;
          }
          else {
            local_b0 = strlen(*(char **)(slashPos + 0xa8));
          }
          local_98 = sVar1 - local_b0;
        }
        sVar5 = strlen(local_a8);
        if ((sVar5 == local_98) && (iVar2 = strncmp((char *)pathLen,local_a8,local_98), iVar2 == 0))
        {
          Curl_infof((Curl_easy *)ftp,"Request has same path as previous transfer\n");
          slashPos[0xb2] = '\x01';
        }
      }
    }
    (*Curl_cfree)((void *)pathLen);
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf((Curl_easy *)ftp,"Uploading to a URL without a file name!");
    (*Curl_cfree)((void *)pathLen);
    conn_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  return conn_local._4_4_;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slashPos = NULL;
  const char *fileName = NULL;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL; /* url-decoded "raw" path */
  size_t pathLen = 0;

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  /* url-decode ftp path before further evaluation */
  result = Curl_urldecode(data, ftp->path, 0, &rawPath, &pathLen, REJECT_CTRL);
  if(result)
    return result;

  switch(data->set.ftp_filemethod) {
    case FTPFILE_NOCWD: /* fastest, but less standard-compliant */

      if((pathLen > 0) && (rawPath[pathLen - 1] != '/'))
          fileName = rawPath;  /* this is a full file path */
      /*
        else: ftpc->file is not used anywhere other than for operations on
              a file. In other words, never for directory operations.
              So we can safely leave filename as NULL here and use it as a
              argument in dir/file decisions.
      */
      break;

    case FTPFILE_SINGLECWD:
      slashPos = strrchr(rawPath, '/');
      if(slashPos) {
        /* get path before last slash, except for / */
        size_t dirlen = slashPos - rawPath;
        if(dirlen == 0)
            dirlen++;

        ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        ftpc->dirs[0] = calloc(1, dirlen + 1);
        if(!ftpc->dirs[0]) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        strncpy(ftpc->dirs[0], rawPath, dirlen);
        ftpc->dirdepth = 1; /* we consider it to be a single dir */
        fileName = slashPos + 1; /* rest is file name */
      }
      else
        fileName = rawPath; /* file name only (or empty) */
      break;

    default: /* allow pretty much anything */
    case FTPFILE_MULTICWD: {
      /* current position: begin of next path component */
      const char *curPos = rawPath;

      int dirAlloc = 0; /* number of entries allocated for the 'dirs' array */
      const char *str = rawPath;
      for(; *str != 0; ++str)
        if (*str == '/')
          ++dirAlloc;

      if(dirAlloc > 0) {
        ftpc->dirs = calloc(dirAlloc, sizeof(ftpc->dirs[0]));
        if(!ftpc->dirs) {
          free(rawPath);
          return CURLE_OUT_OF_MEMORY;
        }

        /* parse the URL path into separate path components */
        while((slashPos = strchr(curPos, '/')) != NULL) {
          size_t compLen = slashPos - curPos;

          /* path starts with a slash: add that as a directory */
          if((compLen == 0) && (ftpc->dirdepth == 0))
            ++compLen;

          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          if(compLen > 0) {
            char *comp = calloc(1, compLen + 1);
            if(!comp) {
              free(rawPath);
              return CURLE_OUT_OF_MEMORY;
            }
            strncpy(comp, curPos, compLen);
            ftpc->dirs[ftpc->dirdepth++] = comp;
          }
          curPos = slashPos + 1;
        }
      }
      DEBUGASSERT(ftpc->dirdepth <= dirAlloc);
      fileName = curPos; /* the rest is the file name (or empty) */
    }
    break;
  } /* switch */

  if(fileName && *fileName)
    ftpc->file = strdup(fileName);
  else
    ftpc->file = NULL; /* instead of point to a zero byte,
                            we make it a NULL pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    free(rawPath);
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
    ftpc->cwddone = TRUE; /* skip CWD for absolute paths */
  else { /* newly created FTP connections are already in entry path */
    const char *oldPath = conn->bits.reuse ? ftpc->prevpath : "";
    if(oldPath) {
      size_t n = pathLen;
      if(data->set.ftp_filemethod == FTPFILE_NOCWD)
        n = 0; /* CWD to entry for relative paths */
      else
        n -= ftpc->file?strlen(ftpc->file):0;

      if((strlen(oldPath) == n) && !strncmp(rawPath, oldPath, n)) {
        infof(data, "Request has same path as previous transfer\n");
        ftpc->cwddone = TRUE;
      }
    }
  }

  free(rawPath);
  return CURLE_OK;
}